

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

void __thiscall re2::Regexp::ParseState::DoCollapse(ParseState *this,RegexpOp op)

{
  byte bVar1;
  undefined1 uVar2;
  bool bVar3;
  Regexp **ppRVar4;
  long lVar5;
  Regexp *pRVar6;
  Regexp *pRVar7;
  uint nsub;
  StringPiece *pSVar8;
  ParseState *pPVar9;
  ParseState *re;
  uint uVar10;
  ulong uVar11;
  ParseState *pPVar12;
  Regexp **local_58;
  RegexpOp local_4c;
  Regexp **local_48;
  ParseState *local_40;
  ParseState *local_38;
  
  pRVar6 = this->stacktop_;
  if (pRVar6 == (Regexp *)0x0) {
    nsub = 0;
  }
  else {
    bVar1 = pRVar6->op_;
    if (bVar1 < 0x16) {
      nsub = 0;
      pRVar7 = pRVar6;
      do {
        uVar10 = 1;
        if (bVar1 == op) {
          uVar10 = (uint)pRVar7->nsub_;
        }
        nsub = nsub + uVar10;
        pRVar7 = pRVar7->down_;
        if (pRVar7 == (Regexp *)0x0) {
          pRVar7 = (Regexp *)0x0;
          break;
        }
        bVar1 = pRVar7->op_;
      } while (bVar1 < 0x16);
    }
    else {
      pRVar7 = (Regexp *)0x0;
      nsub = 0;
    }
    if ((pRVar6 != (Regexp *)0x0) && (pRVar6->down_ == pRVar7)) {
      return;
    }
  }
  pPVar9 = (ParseState *)&stack0xffffffffffffffa7;
  ppRVar4 = __gnu_cxx::new_allocator<re2::Regexp_*>::allocate
                      ((new_allocator<re2::Regexp_*> *)pPVar9,(ulong)nsub,(void *)0x0);
  re = (ParseState *)this->stacktop_;
  pPVar12 = (ParseState *)0x0;
  local_58 = ppRVar4;
  local_40 = this;
  if (re != (ParseState *)0x0) {
    uVar2 = (undefined1)re->flags_;
    if ((byte)uVar2 < (OneLine|ClassNL|Literal)) {
      local_48 = ppRVar4 + -1;
      local_4c = op;
      uVar10 = nsub;
      do {
        pPVar12 = (ParseState *)(re->whole_regexp_).size_;
        if ((byte)uVar2 == op) {
          uVar11 = (ulong)*(ushort *)&re->field_0x6;
          if (uVar11 < 2) {
            pSVar8 = &re->whole_regexp_;
          }
          else {
            pSVar8 = (StringPiece *)(re->whole_regexp_).data_;
          }
          local_38 = pPVar12;
          if (uVar11 != 0) {
            ppRVar4 = local_48 + (int)uVar10;
            uVar11 = uVar11 + 1;
            do {
              pRVar6 = Incref(*(Regexp **)((long)(pSVar8 + -1) + uVar11 * 8));
              *ppRVar4 = pRVar6;
              uVar10 = uVar10 - 1;
              ppRVar4 = ppRVar4 + -1;
              uVar11 = uVar11 - 1;
            } while (1 < uVar11);
          }
          ppRVar4 = local_58;
          Decref((Regexp *)re);
          pPVar9 = re;
          re = local_38;
          op = local_4c;
        }
        else {
          FinishRegexp(pPVar9,(Regexp *)re);
          lVar5 = (long)(int)uVar10;
          uVar10 = uVar10 - 1;
          ppRVar4[lVar5 + -1] = (Regexp *)re;
          re = pPVar12;
        }
        if (re == (ParseState *)0x0) goto LAB_001cccf6;
        uVar2 = (undefined1)re->flags_;
        pPVar12 = re;
      } while ((byte)uVar2 < (OneLine|ClassNL|Literal));
    }
    else {
LAB_001cccf6:
      pPVar12 = (ParseState *)0x0;
    }
  }
  pPVar9 = local_40;
  pRVar6 = ConcatOrAlternate(op,ppRVar4,nsub,local_40->flags_,true);
  bVar3 = ComputeSimple(pRVar6);
  pRVar6->simple_ = bVar3;
  pRVar6->down_ = (Regexp *)pPVar12;
  pPVar9->stacktop_ = pRVar6;
  if (ppRVar4 != (Regexp **)0x0) {
    operator_delete(ppRVar4);
  }
  return;
}

Assistant:

void Regexp::ParseState::DoCollapse(RegexpOp op) {
  // Scan backward to marker, counting children of composite.
  int n = 0;
  Regexp* next = NULL;
  Regexp* sub;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op)
      n += sub->nsub_;
    else
      n++;
  }

  // If there's just one child, leave it alone.
  // (Concat of one thing is that one thing; alternate of one thing is same.)
  if (stacktop_ != NULL && stacktop_->down_ == next)
    return;

  // Construct op (alternation or concatenation), flattening op of op.
  PODArray<Regexp*> subs(n);
  next = NULL;
  int i = n;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op) {
      Regexp** sub_subs = sub->sub();
      for (int k = sub->nsub_ - 1; k >= 0; k--)
        subs[--i] = sub_subs[k]->Incref();
      sub->Decref();
    } else {
      subs[--i] = FinishRegexp(sub);
    }
  }

  Regexp* re = ConcatOrAlternate(op, subs.data(), n, flags_, true);
  re->simple_ = re->ComputeSimple();
  re->down_ = next;
  stacktop_ = re;
}